

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O1

int mod2dense_forcibly_invert(mod2dense *m,mod2dense *r,int *a_row,int *a_col)

{
  uint *puVar1;
  uint uVar2;
  mod2word **ppmVar3;
  mod2word *pmVar4;
  mod2word *pmVar5;
  uint uVar6;
  int iVar7;
  int extraout_EAX;
  uint uVar8;
  FILE *pFVar9;
  FILE *pFVar10;
  mod2entry *extraout_RAX;
  mod2entry *pmVar11;
  size_t sVar12;
  byte bVar13;
  mod2sparse *unaff_RBX;
  uint uVar14;
  int row;
  ulong uVar15;
  int *piVar16;
  FILE *pFVar17;
  ulong uVar18;
  long lVar19;
  int iStack_c4;
  mod2sparse *pmStack_c0;
  FILE *pFStack_b8;
  
  uVar8 = m->n_rows;
  pFVar17 = (FILE *)(ulong)uVar8;
  if (uVar8 == m->n_cols) {
    if (r == m) goto LAB_00123ddb;
    if ((r->n_rows == uVar8) && (r->n_cols == uVar8)) {
      uVar2 = m->n_words;
      mod2dense_clear(r);
      if (0 < (int)uVar8) {
        uVar14 = 0;
        do {
          mod2dense_set(r,uVar14,uVar14,1);
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
      if (0 < (int)uVar8) {
        pFVar9 = (FILE *)0x0;
        do {
          a_row[(long)pFVar9] = -1;
          a_col[(long)pFVar9] = (int)pFVar9;
          pFVar9 = (FILE *)((long)&pFVar9->_flags + 1);
        } while (pFVar17 != pFVar9);
      }
      if (0 < (int)uVar8) {
        pFVar9 = (FILE *)0x0;
        do {
          uVar14 = (uint)pFVar9;
          uVar18 = (ulong)pFVar9 >> 5 & 0x7ffffff;
          bVar13 = (byte)pFVar9 & 0x1f;
          pFVar10 = pFVar9;
          do {
            if ((m->col[(long)pFVar10][uVar18] & 1 << bVar13) != 0) goto LAB_00123c98;
            pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
          } while (pFVar17 != pFVar10);
          pFVar10 = (FILE *)(ulong)uVar8;
LAB_00123c98:
          uVar6 = (uint)pFVar10;
          if ((uint)pFVar10 == uVar8) {
            mod2dense_set(m,uVar14,uVar14,1);
            a_row[(long)pFVar9] = uVar14;
            uVar6 = uVar14;
          }
          if (pFVar9 != (FILE *)(ulong)uVar6) {
            ppmVar3 = m->col;
            pmVar4 = ppmVar3[(long)pFVar9];
            ppmVar3[(long)pFVar9] = ppmVar3[(int)uVar6];
            m->col[(int)uVar6] = pmVar4;
            ppmVar3 = r->col;
            pmVar4 = ppmVar3[(long)pFVar9];
            ppmVar3[(long)pFVar9] = ppmVar3[(int)uVar6];
            r->col[(int)uVar6] = pmVar4;
            iVar7 = a_col[(long)pFVar9];
            a_col[(long)pFVar9] = a_col[(int)uVar6];
            a_col[(int)uVar6] = iVar7;
          }
          pFVar10 = (FILE *)0x0;
          do {
            if (pFVar10 != pFVar9) {
              pmVar4 = m->col[(long)pFVar10];
              if ((pmVar4[uVar18] & 1 << bVar13) != 0) {
                if ((int)uVar18 < (int)uVar2) {
                  pmVar5 = m->col[(long)pFVar9];
                  uVar15 = (ulong)pFVar9 >> 5;
                  do {
                    puVar1 = pmVar4 + uVar15;
                    *puVar1 = *puVar1 ^ pmVar5[uVar15];
                    uVar15 = uVar15 + 1;
                  } while ((uVar2 + (int)((ulong)pFVar9 >> 5)) - (int)uVar18 != uVar15);
                }
                if (0 < (int)uVar2) {
                  pmVar4 = r->col[(long)pFVar10];
                  pmVar5 = r->col[(long)pFVar9];
                  uVar15 = 0;
                  do {
                    puVar1 = pmVar4 + uVar15;
                    *puVar1 = *puVar1 ^ pmVar5[uVar15];
                    uVar15 = uVar15 + 1;
                  } while (uVar2 != uVar15);
                }
              }
            }
            pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
          } while (pFVar10 != pFVar17);
          pFVar9 = (FILE *)((long)&pFVar9->_flags + 1);
        } while (pFVar9 != pFVar17);
      }
      if ((int)uVar8 < 1) {
        iVar7 = 0;
      }
      else {
        pFVar9 = (FILE *)0x0;
        iVar7 = 0;
        do {
          if (a_row[(long)pFVar9] != -1) {
            a_row[iVar7] = a_row[(long)pFVar9];
            a_col[iVar7] = a_col[(long)pFVar9];
            iVar7 = iVar7 + 1;
          }
          pFVar9 = (FILE *)((long)&pFVar9->_flags + 1);
        } while (pFVar17 != pFVar9);
      }
      return iVar7;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_00123ddb:
  mod2dense_forcibly_invert_cold_3();
  if ((((FILE *)m)->_flags <= ((mod2sparse *)r)->n_rows) &&
     (unaff_RBX = (mod2sparse *)r, pFVar17 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= ((mod2sparse *)r)->n_cols)) {
    mod2dense_clear(r);
    iVar7 = extraout_EAX;
    if (0 < ((FILE *)m)->_flags) {
      lVar19 = 0;
      do {
        for (piVar16 = *(int **)(((FILE *)m)->_IO_read_ptr + lVar19 * 0x38 + 0x10); -1 < *piVar16;
            piVar16 = *(int **)(piVar16 + 4)) {
          mod2dense_set(r,(int)lVar19,piVar16[1],1);
        }
        lVar19 = lVar19 + 1;
        iVar7 = ((FILE *)m)->_flags;
      } while (lVar19 < iVar7);
    }
    return iVar7;
  }
  mod2sparse_to_dense_cold_1();
  if ((((FILE *)m)->_flags <= ((mod2sparse *)r)->n_rows) &&
     (unaff_RBX = (mod2sparse *)r, pFVar17 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= ((mod2sparse *)r)->n_cols)) {
    mod2sparse_clear((mod2sparse *)r);
    iVar7 = (int)extraout_RAX;
    if (0 < ((FILE *)m)->_flags) {
      row = 0;
      pmVar11 = extraout_RAX;
      do {
        if (0 < *(int *)&((FILE *)m)->field_0x4) {
          iVar7 = 0;
          do {
            uVar8 = mod2dense_get(m,row,iVar7);
            pmVar11 = (mod2entry *)(ulong)uVar8;
            if (uVar8 != 0) {
              pmVar11 = mod2sparse_insert((mod2sparse *)r,row,iVar7);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 < *(int *)&((FILE *)m)->field_0x4);
        }
        iVar7 = (int)pmVar11;
        row = row + 1;
      } while (row < ((FILE *)m)->_flags);
    }
    return iVar7;
  }
  mod2dense_to_sparse_cold_1();
  lVar19 = 0;
  pmStack_c0 = unaff_RBX;
  pFStack_b8 = pFVar17;
  do {
    sVar12 = fread((void *)((long)&iStack_c4 + lVar19),1,1,(FILE *)m);
    if (sVar12 != 1) {
      return 0;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  return iStack_c4;
}

Assistant:

int mod2dense_forcibly_invert 
( mod2dense *m, 	/* The matrix to find the inverse of (destroyed) */
  mod2dense *r,		/* Place to store the inverse */
  int *a_row,		/* Place to store row indexes of altered elements */
  int *a_col		/* Place to store column indexes of altered elements */
)
{
  mod2word *s, *t;
  int i, j, k, n, w, k0, b0;
  int u, c;

  if (mod2dense_rows(m)!=mod2dense_cols(m))
  { fprintf(stderr,
      "mod2dense_forcibly_invert: Matrix to invert is not square\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
      "mod2dense_forcibly_invert: Result matrix is the same as the operand\n");
    exit(1);
  }

  n = mod2dense_rows(m);
  w = m->n_words;

  if (mod2dense_rows(r)!=n || mod2dense_cols(r)!=n)
  { fprintf(stderr,
 "mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n");
    exit(1);
  }

  mod2dense_clear(r);
  for (i = 0; i<n; i++) 
  { mod2dense_set(r,i,i,1);
  }

  for (i = 0; i<n; i++)
  { a_row[i] = -1;
    a_col[i] = i;
  }

  for (i = 0; i<n; i++)
  { 
    k0 = i >> mod2_wordsize_shift;
    b0 = i & mod2_wordsize_mask;

    for (j = i; j<n; j++) 
    { if (mod2_getbit(m->col[j][k0],b0)) break;
    }

    if (j==n)
    { j = i;
      mod2dense_set(m,i,j,1);
      a_row[i] = i;
    }

    if (j!=i)
    { 
      t = m->col[i];
      m->col[i] = m->col[j];
      m->col[j] = t;

      t = r->col[i];
      r->col[i] = r->col[j];
      r->col[j] = t;

      u = a_col[i];
      a_col[i] = a_col[j];
      a_col[j] = u;
    }

    for (j = 0; j<n; j++)
    { if (j!=i && mod2_getbit(m->col[j][k0],b0))
      { s = m->col[j];
        t = m->col[i];
        for (k = k0; k<w; k++) s[k] ^= t[k];
        s = r->col[j];
        t = r->col[i];
        for (k = 0; k<w; k++) s[k] ^= t[k];
      }
    }
  }

  c = 0;
  for (i = 0; i<n; i++)
  { if (a_row[i]!=-1)
    { a_row[c] = a_row[i];
      a_col[c] = a_col[i];
      c += 1;
    }
  }

  return c;
}